

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

bool __thiscall
duckdb::WindowDistinctAggregatorGlobalState::TryPrepareNextStage
          (WindowDistinctAggregatorGlobalState *this,WindowDistinctAggregatorLocalState *lstate)

{
  GlobalSortStatePtr *pGVar1;
  ulong uVar2;
  pointer pGVar3;
  bool bVar4;
  
  ::std::mutex::lock(&this->lock);
  switch((this->stage)._M_i) {
  case INIT:
    this->total_tasks =
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->local_sorts).
               super_vector<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    this->tasks_assigned = 0;
    LOCK();
    (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    bVar4 = true;
    LOCK();
    (this->stage)._M_i = SCAN;
    UNLOCK();
    lstate->stage = SCAN;
    this->tasks_assigned = 1;
    lstate->block_idx = 0;
    goto LAB_01aab5c1;
  case SCAN:
    uVar2 = this->tasks_assigned;
    if (this->total_tasks <= uVar2) {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
LAB_01aab5a4:
        bVar4 = false;
        goto LAB_01aab5c1;
      }
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::PrepareMergePhase(pGVar3);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        LOCK();
        (this->stage)._M_i = MERGE;
        UNLOCK();
LAB_01aab5ff:
        lstate->stage = MERGE;
        this->total_tasks =
             (this->super_WindowAggregatorGlobalState).locals.super___atomic_base<unsigned_long>.
             _M_i;
        this->tasks_assigned = 1;
        LOCK();
        (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
        UNLOCK();
        break;
      }
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if ((pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pGVar3->sorted_blocks).
          super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        MeasurePayloadBlocks(this);
        ::std::
        vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
        ::resize(&(this->seconds).
                  super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ,((long)(this->block_starts).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->block_starts).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) - 1);
        goto LAB_01aab545;
      }
      goto switchD_01aab37b_caseD_2;
    }
    lstate->stage = SCAN;
LAB_01aab425:
    this->tasks_assigned = uVar2 + 1;
    lstate->block_idx = uVar2;
    break;
  case MERGE:
    uVar2 = this->tasks_assigned;
    if (uVar2 < this->total_tasks) {
      lstate->stage = MERGE;
      this->tasks_assigned = uVar2 + 1;
    }
    else {
      if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned)
      goto LAB_01aab5a4;
      pGVar1 = &this->global_sort;
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      GlobalSortState::CompleteMergeRound(pGVar3,true);
      pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(pGVar1);
      if (8 < (ulong)((long)(pGVar3->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar3->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator->(pGVar1);
        GlobalSortState::InitializeMergeRound(pGVar3);
        goto LAB_01aab5ff;
      }
      MeasurePayloadBlocks(this);
      ::std::
      vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
      ::resize(&(this->seconds).
                super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
               ,((long)(this->block_starts).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->block_starts).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) - 1);
LAB_01aab545:
      this->total_tasks =
           (long)(this->seconds).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->seconds).
                 super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 .
                 super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
      LOCK();
      (this->tasks_completed).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      this->tasks_assigned = 0;
      LOCK();
      (this->stage)._M_i = SORTED;
      UNLOCK();
      lstate->stage = SORTED;
      this->tasks_assigned = 1;
      lstate->block_idx = 0;
    }
    break;
  case SORTED:
    uVar2 = this->tasks_assigned;
    if (uVar2 < this->total_tasks) {
      lstate->stage = SORTED;
      goto LAB_01aab425;
    }
    if ((this->tasks_completed).super___atomic_base<unsigned_long>._M_i < this->tasks_assigned) {
      lstate->stage = FINISHED;
      goto LAB_01aab5a4;
    }
    PatchPrevIdcs(this);
  default:
switchD_01aab37b_caseD_2:
    LOCK();
    (this->stage)._M_i = FINISHED;
    UNLOCK();
    lstate->stage = FINISHED;
  }
  bVar4 = true;
LAB_01aab5c1:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return bVar4;
}

Assistant:

bool WindowDistinctAggregatorGlobalState::TryPrepareNextStage(WindowDistinctAggregatorLocalState &lstate) {
	lock_guard<mutex> stage_guard(lock);

	switch (stage.load()) {
	case PartitionSortStage::INIT:
		//	5: Sort sorted lexicographically increasing
		total_tasks = local_sorts.size();
		tasks_assigned = 0;
		tasks_completed = 0;
		lstate.stage = stage = PartitionSortStage::SCAN;
		lstate.block_idx = tasks_assigned++;
		return true;
	case PartitionSortStage::SCAN:
		// Process all the local sorts
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::SCAN;
			lstate.block_idx = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->PrepareMergePhase();
		if (!(global_sort->sorted_blocks.size() / 2)) {
			if (global_sort->sorted_blocks.empty()) {
				lstate.stage = stage = PartitionSortStage::FINISHED;
				return true;
			}
			MeasurePayloadBlocks();
			seconds.resize(block_starts.size() - 1);
			total_tasks = seconds.size();
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.stage = stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.stage = stage = PartitionSortStage::MERGE;
		total_tasks = locals;
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::MERGE:
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::MERGE;
			++tasks_assigned;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			return false;
		}
		global_sort->CompleteMergeRound(true);
		if (!(global_sort->sorted_blocks.size() / 2)) {
			MeasurePayloadBlocks();
			seconds.resize(block_starts.size() - 1);
			total_tasks = seconds.size();
			tasks_completed = 0;
			tasks_assigned = 0;
			lstate.stage = stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		}
		global_sort->InitializeMergeRound();
		lstate.stage = PartitionSortStage::MERGE;
		total_tasks = locals;
		tasks_assigned = 1;
		tasks_completed = 0;
		return true;
	case PartitionSortStage::SORTED:
		if (tasks_assigned < total_tasks) {
			lstate.stage = PartitionSortStage::SORTED;
			lstate.block_idx = tasks_assigned++;
			return true;
		} else if (tasks_completed < tasks_assigned) {
			lstate.stage = PartitionSortStage::FINISHED;
			// Sleep while other tasks finish
			return false;
		}
		// Last task patches the boundaries
		PatchPrevIdcs();
		break;
	default:
		break;
	}

	lstate.stage = stage = PartitionSortStage::FINISHED;

	return true;
}